

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::wsi::anon_unknown_0::TriangleRenderer::createPipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device)

{
  undefined1 local_60 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkPushConstantRange pushConstantRange;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  stack0xffffffffffffffd4 = 1;
  local_60._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutParams._4_4_ = 0;
  pipelineLayoutParams.pNext._0_4_ = 0;
  pipelineLayoutParams.pNext._4_4_ = 0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts._0_4_ = 1;
  pipelineLayoutParams._32_8_ = (long)&pipelineLayoutParams.pPushConstantRanges + 4;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vkd,device,(VkPipelineLayoutCreateInfo *)local_60,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> TriangleRenderer::createPipelineLayout (const DeviceInterface&	vkd,
															   const VkDevice			device)
{
	const VkPushConstantRange						pushConstantRange		=
	{
		VK_SHADER_STAGE_VERTEX_BIT,
		0u,											// offset
		(deUint32)sizeof(deUint32),					// size
	};
	const VkPipelineLayoutCreateInfo				pipelineLayoutParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
		DE_NULL,
		(vk::VkPipelineLayoutCreateFlags)0,
		0u,											// setLayoutCount
		DE_NULL,									// pSetLayouts
		1u,
		&pushConstantRange,
	};

	return vk::createPipelineLayout(vkd, device, &pipelineLayoutParams);
}